

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::RgbToBgr
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uchar *puVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inX;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  uint8_t colorCount;
  int iVar7;
  undefined4 in_stack_ffffffffffffff1c;
  int iVar8;
  undefined4 in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff38;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff50;
  uchar *local_a8;
  uint32_t in_stack_ffffffffffffff60;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff68;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  uint32_t *in_stack_ffffffffffffff80;
  
  iVar7 = in_stack_00000008;
  iVar8 = in_stack_00000010;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff50,(uint32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             (uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff60,
             (uint32_t)in_stack_ffffffffffffff68);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff24,iVar8),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff1c,iVar7));
  VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff24,iVar8),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff1c,iVar7));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1259d5);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff24,iVar8),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff1c,iVar7));
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff80,
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x125a3f);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
  puVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  puVar3 = puVar3 + (ulong)(uint)(in_ESI * 3) + (ulong)(in_EDX * uVar1);
  puVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
  puVar4 = puVar4 + (ulong)(uint)(in_R8D * 3) + (ulong)(in_R9D * uVar2);
  puVar5 = puVar4 + in_stack_00000010 * uVar2;
  for (; puVar4 != puVar5; puVar4 = puVar4 + uVar2) {
    local_a8 = puVar3;
    for (puVar6 = puVar4; puVar6 != puVar4 + (uint)(in_stack_00000008 * 3); puVar6 = puVar6 + 3) {
      puVar6[2] = *local_a8;
      puVar6[1] = local_a8[1];
      *puVar6 = local_a8[2];
      local_a8 = local_a8 + 3;
    }
    puVar3 = puVar3 + uVar1;
  }
  return;
}

Assistant:

void RgbToBgr( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                   uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyRGBImage     ( in, out );

        const uint8_t colorCount = RGB;
        width = width * colorCount;

        OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; outX += colorCount, inX += colorCount ) {
                *(outX + 2) = *(inX);
                *(outX + 1) = *(inX + 1);
                *(outX) = *(inX + 2);
            }
        }
    }